

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_error_inval(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  char *loop;
  sockaddr_in addr2;
  sockaddr_in addr1;
  uv_tcp_t server;
  sockaddr_in sStack_690;
  uv_buf_t uStack_680;
  undefined1 auStack_670 [328];
  undefined1 auStack_528 [192];
  void *pvStack_468;
  uv_tcp_t uStack_458;
  uv_loop_t *puStack_360;
  sockaddr_in sStack_350;
  uv_tcp_t uStack_340;
  uv_loop_t *puStack_248;
  sockaddr_in sStack_238;
  uv_tcp_t uStack_228;
  uv_loop_t *puStack_130;
  sockaddr_in local_120;
  sockaddr_in local_110;
  uv_tcp_t local_100;
  
  puStack_130 = (uv_loop_t *)0x16da2d;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_110);
  if (iVar1 == 0) {
    puStack_130 = (uv_loop_t *)0x16da4b;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,&local_120);
    if (iVar1 != 0) goto LAB_0016db09;
    puStack_130 = (uv_loop_t *)0x16da58;
    puVar2 = uv_default_loop();
    puStack_130 = (uv_loop_t *)0x16da65;
    iVar1 = uv_tcp_init(puVar2,&local_100);
    if (iVar1 != 0) goto LAB_0016db0e;
    puStack_130 = (uv_loop_t *)0x16da7e;
    iVar1 = uv_tcp_bind(&local_100,(sockaddr *)&local_110,0);
    if (iVar1 != 0) goto LAB_0016db13;
    puStack_130 = (uv_loop_t *)0x16da97;
    iVar1 = uv_tcp_bind(&local_100,(sockaddr *)&local_120,0);
    if (iVar1 != -0x16) goto LAB_0016db18;
    puStack_130 = (uv_loop_t *)0x16daad;
    uv_close((uv_handle_t *)&local_100,close_cb);
    puStack_130 = (uv_loop_t *)0x16dab2;
    puVar2 = uv_default_loop();
    puStack_130 = (uv_loop_t *)0x16dabc;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0016db1d;
    puStack_130 = (uv_loop_t *)0x16daca;
    unaff_RBX = uv_default_loop();
    puStack_130 = (uv_loop_t *)0x16dade;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_130 = (uv_loop_t *)0x16dae8;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_130 = (uv_loop_t *)0x16daed;
    puVar2 = uv_default_loop();
    puStack_130 = (uv_loop_t *)0x16daf5;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_130 = (uv_loop_t *)0x16db09;
    run_test_tcp_bind_error_inval_cold_1();
LAB_0016db09:
    puStack_130 = (uv_loop_t *)0x16db0e;
    run_test_tcp_bind_error_inval_cold_2();
LAB_0016db0e:
    puStack_130 = (uv_loop_t *)0x16db13;
    run_test_tcp_bind_error_inval_cold_3();
LAB_0016db13:
    puStack_130 = (uv_loop_t *)0x16db18;
    run_test_tcp_bind_error_inval_cold_4();
LAB_0016db18:
    puStack_130 = (uv_loop_t *)0x16db1d;
    run_test_tcp_bind_error_inval_cold_5();
LAB_0016db1d:
    puStack_130 = (uv_loop_t *)0x16db22;
    run_test_tcp_bind_error_inval_cold_6();
  }
  puStack_130 = (uv_loop_t *)run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  puStack_248 = (uv_loop_t *)0x16db45;
  puStack_130 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_238);
  if (iVar1 == 0) {
    puStack_248 = (uv_loop_t *)0x16db4e;
    puVar2 = uv_default_loop();
    puStack_248 = (uv_loop_t *)0x16db5b;
    iVar1 = uv_tcp_init(puVar2,&uStack_228);
    if (iVar1 != 0) goto LAB_0016dbb8;
    puStack_248 = (uv_loop_t *)0x16db70;
    iVar1 = uv_tcp_bind(&uStack_228,(sockaddr *)&sStack_238,0);
    if (iVar1 != 0) goto LAB_0016dbbd;
    puStack_248 = (uv_loop_t *)0x16db79;
    unaff_RBX = uv_default_loop();
    puStack_248 = (uv_loop_t *)0x16db8d;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_248 = (uv_loop_t *)0x16db97;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_248 = (uv_loop_t *)0x16db9c;
    puVar2 = uv_default_loop();
    puStack_248 = (uv_loop_t *)0x16dba4;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_248 = (uv_loop_t *)0x16dbb8;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_0016dbb8:
    puStack_248 = (uv_loop_t *)0x16dbbd;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_0016dbbd:
    puStack_248 = (uv_loop_t *)0x16dbc2;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  puStack_248 = (uv_loop_t *)run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  puStack_360 = (uv_loop_t *)0x16dbe5;
  puStack_248 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_350);
  if (iVar1 == 0) {
    puStack_360 = (uv_loop_t *)0x16dbee;
    puVar2 = uv_default_loop();
    puStack_360 = (uv_loop_t *)0x16dbfb;
    iVar1 = uv_tcp_init(puVar2,&uStack_340);
    if (iVar1 != 0) goto LAB_0016dc5c;
    puStack_360 = (uv_loop_t *)0x16dc13;
    iVar1 = uv_tcp_bind(&uStack_340,(sockaddr *)&sStack_350,1);
    if (iVar1 != -0x16) goto LAB_0016dc61;
    puStack_360 = (uv_loop_t *)0x16dc1d;
    unaff_RBX = uv_default_loop();
    puStack_360 = (uv_loop_t *)0x16dc31;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_360 = (uv_loop_t *)0x16dc3b;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_360 = (uv_loop_t *)0x16dc40;
    puVar2 = uv_default_loop();
    puStack_360 = (uv_loop_t *)0x16dc48;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_360 = (uv_loop_t *)0x16dc5c;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_0016dc5c:
    puStack_360 = (uv_loop_t *)0x16dc61;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_0016dc61:
    puStack_360 = (uv_loop_t *)0x16dc66;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  puStack_360 = (uv_loop_t *)run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pvStack_468 = (void *)0x16dc78;
  puStack_360 = unaff_RBX;
  puVar2 = uv_default_loop();
  pvStack_468 = (void *)0x16dc85;
  iVar1 = uv_tcp_init(puVar2,&uStack_458);
  if (iVar1 == 0) {
    pvStack_468 = (void *)0x16dc9a;
    iVar1 = uv_listen((uv_stream_t *)&uStack_458,0x80,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0016dce2;
    pvStack_468 = (void *)0x16dca3;
    unaff_RBX = uv_default_loop();
    pvStack_468 = (void *)0x16dcb7;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pvStack_468 = (void *)0x16dcc1;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pvStack_468 = (void *)0x16dcc6;
    puVar2 = uv_default_loop();
    pvStack_468 = (void *)0x16dcce;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pvStack_468 = (void *)0x16dce2;
    run_test_tcp_listen_without_bind_cold_1();
LAB_0016dce2:
    pvStack_468 = (void *)0x16dce7;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pvStack_468 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  loop = "0.0.0.0";
  pvStack_468 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_690);
  if (iVar1 == 0) {
    loop = (char *)uv_default_loop();
    iVar1 = uv_tcp_init((uv_loop_t *)loop,(uv_tcp_t *)auStack_670);
    if (iVar1 != 0) goto LAB_0016de66;
    loop = auStack_670;
    iVar1 = uv_tcp_bind((uv_tcp_t *)loop,(sockaddr *)&sStack_690,0);
    if (iVar1 != 0) goto LAB_0016de6b;
    loop = auStack_670;
    iVar1 = uv_listen((uv_stream_t *)loop,0x80,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0016de70;
    loop = auStack_670;
    iVar1 = uv_is_writable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_0016de75;
    loop = auStack_670;
    iVar1 = uv_is_readable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_0016de7a;
    uStack_680 = uv_buf_init("PING",4);
    loop = auStack_528;
    iVar1 = uv_write((uv_write_t *)loop,(uv_stream_t *)auStack_670,&uStack_680,1,(uv_write_cb)0x0);
    if (iVar1 != -0x20) goto LAB_0016de7f;
    loop = auStack_670 + 0xf8;
    iVar1 = uv_shutdown((uv_shutdown_t *)loop,(uv_stream_t *)auStack_670,(uv_shutdown_cb)0x0);
    if (iVar1 != -0x6b) goto LAB_0016de84;
    loop = auStack_670;
    iVar1 = uv_read_start((uv_stream_t *)loop,(uv_alloc_cb)0x0,(uv_read_cb)0x0);
    if (iVar1 != -0x6b) goto LAB_0016de89;
    uv_close((uv_handle_t *)auStack_670,close_cb);
    loop = (char *)uv_default_loop();
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016de93;
    }
  }
  else {
    run_test_tcp_bind_writable_flags_cold_1();
LAB_0016de66:
    run_test_tcp_bind_writable_flags_cold_2();
LAB_0016de6b:
    run_test_tcp_bind_writable_flags_cold_3();
LAB_0016de70:
    run_test_tcp_bind_writable_flags_cold_4();
LAB_0016de75:
    run_test_tcp_bind_writable_flags_cold_5();
LAB_0016de7a:
    run_test_tcp_bind_writable_flags_cold_6();
LAB_0016de7f:
    run_test_tcp_bind_writable_flags_cold_7();
LAB_0016de84:
    run_test_tcp_bind_writable_flags_cold_8();
LAB_0016de89:
    run_test_tcp_bind_writable_flags_cold_9();
  }
  run_test_tcp_bind_writable_flags_cold_10();
LAB_0016de93:
  run_test_tcp_bind_writable_flags_cold_11();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_bind_error_inval) {
  struct sockaddr_in addr1;
  struct sockaddr_in addr2;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr1));
  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT_2, &addr2));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr1, 0);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr2, 0);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}